

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O2

void __thiscall
MipsOpcodeFormatter::handleOpcodeName(MipsOpcodeFormatter *this,MipsOpcodeData *opData)

{
  char cVar1;
  char *pcVar2;
  
  pcVar2 = (opData->opcode).name;
  while (cVar1 = *pcVar2, cVar1 != '\0') {
    pcVar2 = pcVar2 + 1;
    if (cVar1 != 'B') {
      std::__cxx11::string::push_back((char)this);
    }
  }
  return;
}

Assistant:

void MipsOpcodeFormatter::handleOpcodeName(const MipsOpcodeData& opData)
{
	const char* encoding = opData.opcode.name;

	while (*encoding != 0)
	{
		switch (*encoding++)
		{
		case 'S':
			buffer += "sptq"[opData.vfpuSize];
			break;
		case 'B':
			// TODO
			break;
		default:
			buffer += *(encoding-1);
			break;
		}
	}
}